

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O1

void __thiscall
FMapInfoParser::ParseMapInfo
          (FMapInfoParser *this,int lump,level_info_t *gamedefaults,level_info_t *defaultinfo)

{
  level_info_t *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  level_info_t *info;
  ulong uVar7;
  long lVar8;
  FScanner saved_sc;
  FScanner local_130;
  
  FScanner::OpenLumpNum(&this->sc,lump);
  level_info_t::operator=(defaultinfo,gamedefaults);
  this->HexenHack = false;
  bVar2 = FScanner::GetString(&this->sc);
  if (bVar2) {
    do {
      bVar2 = FScanner::Compare(&this->sc,"include");
      if (bVar2) {
        FScanner::MustGetString(&this->sc);
        iVar3 = FWadCollection::CheckNumForFullName(&Wads,(this->sc).String,true,0);
        if (iVar3 < 0) {
          FScanner::ScriptError(&this->sc,"include file \'%s\' not found",(this->sc).String);
        }
        iVar4 = FWadCollection::GetLumpFile(&Wads,(this->sc).LumpNum);
        iVar5 = FWadCollection::GetLumpFile(&Wads,iVar3);
        if ((iVar4 != iVar5) &&
           (iVar4 = FWadCollection::GetLumpFile(&Wads,(this->sc).LumpNum), iVar4 == 0)) {
          iVar4 = FWadCollection::GetLumpFile(&Wads,iVar3);
          pcVar6 = FWadCollection::GetWadFullName(&Wads,iVar4);
          I_FatalError("File %s is overriding core lump %s.",pcVar6,(this->sc).String);
        }
        FScanner::FScanner(&local_130,&this->sc);
        ParseMapInfo(this,iVar3,gamedefaults,defaultinfo);
        FScanner::operator=(&this->sc,&local_130);
        FScanner::~FScanner(&local_130);
      }
      else {
        bVar2 = FScanner::Compare(&this->sc,"gamedefaults");
        if (bVar2) {
          level_info_t::Reset(gamedefaults);
          ParseMapDefinition(this,gamedefaults);
          level_info_t::operator=(defaultinfo,gamedefaults);
        }
        else {
          bVar2 = FScanner::Compare(&this->sc,"defaultmap");
          if (bVar2) {
            level_info_t::operator=(defaultinfo,gamedefaults);
          }
          else {
            bVar2 = FScanner::Compare(&this->sc,"adddefaultmap");
            if (!bVar2) {
              bVar2 = FScanner::Compare(&this->sc,"map");
              if (bVar2) {
                info = ParseMapHeader(this,defaultinfo);
                ParseMapDefinition(this,info);
                iVar3 = strcasecmp((info->SkyPic2).Chars,"-NOFLAT-");
                if (iVar3 == 0) {
                  FString::operator=(&info->SkyPic2,&info->SkyPic1);
                }
                plVar1 = wadlevelinfos.Array;
                iVar3 = info->levelnum;
                uVar7 = (ulong)wadlevelinfos.Count;
                if (uVar7 != 0) {
                  lVar8 = 0;
                  do {
                    if (*(int *)((long)&plVar1->levelnum + lVar8) == iVar3) {
                      *(undefined4 *)((long)&plVar1->levelnum + lVar8) = 0;
                    }
                    lVar8 = lVar8 + 0x1b0;
                  } while (uVar7 * 0x1b0 - lVar8 != 0);
                }
                info->levelnum = iVar3;
              }
              else {
                bVar2 = FScanner::Compare(&this->sc,"clusterdef");
                if ((bVar2) ||
                   ((this->format_type != 1 &&
                    (bVar2 = FScanner::Compare(&this->sc,"cluster"), bVar2)))) {
                  ParseCluster(this);
                }
                else {
                  bVar2 = FScanner::Compare(&this->sc,"episode");
                  if (bVar2) {
                    ParseEpisodeInfo(this);
                  }
                  else {
                    bVar2 = FScanner::Compare(&this->sc,"clearepisodes");
                    if (bVar2) {
                      if (AllEpisodes.Count != 0) {
                        TArray<FEpisode,_FEpisode>::DoDelete(&AllEpisodes,0,AllEpisodes.Count - 1);
                        AllEpisodes.Count = 0;
                      }
                    }
                    else {
                      bVar2 = FScanner::Compare(&this->sc,"skill");
                      if (bVar2) {
                        ParseSkill(this);
                      }
                      else {
                        bVar2 = FScanner::Compare(&this->sc,"clearskills");
                        if (bVar2) {
                          if (AllSkills.Count != 0) {
                            TArray<FSkillInfo,_FSkillInfo>::DoDelete
                                      (&AllSkills,0,AllSkills.Count - 1);
                            AllSkills.Count = 0;
                          }
                          DefaultSkill = -1;
                        }
                        else {
                          bVar2 = FScanner::Compare(&this->sc,"gameinfo");
                          if (bVar2) {
                            if (this->format_type == 1) {
                              pcVar6 = "gameinfo definitions not supported with old MAPINFO syntax";
LAB_004b5b0a:
                              FScanner::ScriptError(&this->sc,pcVar6);
                            }
                            else {
                              this->format_type = 2;
                              ParseGameInfo(this);
                            }
                          }
                          else {
                            bVar2 = FScanner::Compare(&this->sc,"intermission");
                            if (bVar2) {
                              if (this->format_type == 1) {
                                pcVar6 = 
                                "intermission definitions not supported with old MAPINFO syntax";
                                goto LAB_004b5b0a;
                              }
                              this->format_type = 2;
                              ParseIntermission(this);
                            }
                            else {
                              bVar2 = FScanner::Compare(&this->sc,"doomednums");
                              if (bVar2) {
                                if (this->format_type == 1) {
                                  pcVar6 = 
                                  "doomednums definitions not supported with old MAPINFO syntax";
                                  goto LAB_004b5b0a;
                                }
                                this->format_type = 2;
                                ParseDoomEdNums(this);
                              }
                              else {
                                bVar2 = FScanner::Compare(&this->sc,"spawnnums");
                                if (bVar2) {
                                  if (this->format_type == 1) {
                                    pcVar6 = 
                                    "spawnnums definitions not supported with old MAPINFO syntax";
                                    goto LAB_004b5b0a;
                                  }
                                  this->format_type = 2;
                                  ParseSpawnNums(this);
                                }
                                else {
                                  bVar2 = FScanner::Compare(&this->sc,"conversationids");
                                  if (bVar2) {
                                    if (this->format_type == 1) {
                                      pcVar6 = 
                                      "conversationids definitions not supported with old MAPINFO syntax"
                                      ;
                                      goto LAB_004b5b0a;
                                    }
                                    this->format_type = 2;
                                    ParseConversationIDs(this);
                                  }
                                  else {
                                    bVar2 = FScanner::Compare(&this->sc,"automap");
                                    if ((bVar2) ||
                                       (bVar2 = FScanner::Compare(&this->sc,"automap_overlay"),
                                       bVar2)) {
                                      if (this->format_type == 1) {
                                        pcVar6 = 
                                        "automap colorset definitions not supported with old MAPINFO syntax"
                                        ;
                                        goto LAB_004b5b0a;
                                      }
                                      this->format_type = 2;
                                      bVar2 = FScanner::Compare(&this->sc,"automap_overlay");
                                      ParseAMColors(this,bVar2);
                                    }
                                    else {
                                      FScanner::ScriptError
                                                (&this->sc,"%s: Unknown top level keyword",
                                                 (this->sc).String);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_004b57ed;
            }
          }
          ParseMapDefinition(this,defaultinfo);
        }
      }
LAB_004b57ed:
      bVar2 = FScanner::GetString(&this->sc);
    } while (bVar2);
  }
  return;
}

Assistant:

void FMapInfoParser::ParseMapInfo (int lump, level_info_t &gamedefaults, level_info_t &defaultinfo)
{
	sc.OpenLumpNum(lump);

	defaultinfo = gamedefaults;
	HexenHack = false;

	while (sc.GetString ())
	{
		if (sc.Compare("include"))
		{
			sc.MustGetString();
			int inclump = Wads.CheckNumForFullName(sc.String, true);
			if (inclump < 0)
			{
				sc.ScriptError("include file '%s' not found", sc.String);
			}
			if (Wads.GetLumpFile(sc.LumpNum) != Wads.GetLumpFile(inclump))
			{
				// Do not allow overriding includes from the default MAPINFO
				if (Wads.GetLumpFile(sc.LumpNum) == 0)
				{
					I_FatalError("File %s is overriding core lump %s.",
						Wads.GetWadFullName(Wads.GetLumpFile(inclump)), sc.String);
				}
			}
			FScanner saved_sc = sc;
			ParseMapInfo(inclump, gamedefaults, defaultinfo);
			sc = saved_sc;
		}
		else if (sc.Compare("gamedefaults"))
		{
			gamedefaults.Reset();
			ParseMapDefinition(gamedefaults);
			defaultinfo = gamedefaults;
		}
		else if (sc.Compare("defaultmap"))
		{
			defaultinfo = gamedefaults;
			ParseMapDefinition(defaultinfo);
		}
		else if (sc.Compare("adddefaultmap"))
		{
			// Same as above but adds to the existing definitions instead of replacing them completely
			ParseMapDefinition(defaultinfo);
		}
		else if (sc.Compare("map"))
		{
			level_info_t *levelinfo = ParseMapHeader(defaultinfo);

			ParseMapDefinition(*levelinfo);

			// When the second sky is -NOFLAT-, make it a copy of the first sky
			if (!levelinfo->SkyPic2.CompareNoCase("-NOFLAT-"))
			{
				levelinfo->SkyPic2 = levelinfo->SkyPic1;
			}
			SetLevelNum (levelinfo, levelinfo->levelnum);	// Wipe out matching levelnums from other maps.
		}
		// clusterdef is the old keyword but the new format has enough 
		// structuring that 'cluster' can be handled, too. The old format does not.
		else if (sc.Compare("clusterdef") || (format_type != FMT_Old && sc.Compare("cluster")))
		{
			ParseCluster();
		}
		else if (sc.Compare("episode"))
		{
			ParseEpisodeInfo();
		}
		else if (sc.Compare("clearepisodes"))
		{
			ClearEpisodes();
		}
		else if (sc.Compare("skill"))
		{
			ParseSkill();
		}
		else if (sc.Compare("clearskills"))
		{
			AllSkills.Clear();
			DefaultSkill = -1;
		}
		else if (sc.Compare("gameinfo"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseGameInfo();
			}
			else
			{
				sc.ScriptError("gameinfo definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("intermission"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseIntermission();
			}
			else
			{
				sc.ScriptError("intermission definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("doomednums"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseDoomEdNums();
			}
			else
			{
				sc.ScriptError("doomednums definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("spawnnums"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseSpawnNums();
			}
			else
			{
				sc.ScriptError("spawnnums definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("conversationids"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseConversationIDs();
			}
			else
			{
				sc.ScriptError("conversationids definitions not supported with old MAPINFO syntax");
			}
		}
		else if (sc.Compare("automap") || sc.Compare("automap_overlay"))
		{
			if (format_type != FMT_Old)
			{
				format_type = FMT_New;
				ParseAMColors(sc.Compare("automap_overlay"));
			}
			else
			{
				sc.ScriptError("automap colorset definitions not supported with old MAPINFO syntax");
			}
		}
		else
		{
			sc.ScriptError("%s: Unknown top level keyword", sc.String);
		}
	}
}